

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapped_transform.cc
# Opt level: O0

void __thiscall
webrtc::LappedTransform::LappedTransform
          (LappedTransform *this,size_t num_in_channels,size_t num_out_channels,size_t chunk_length,
          float *window,size_t block_length,size_t shift_amount,Callback *callback)

{
  int iVar1;
  pointer pRVar2;
  size_t sVar3;
  ostream *poVar4;
  FatalMessage local_808;
  ulong local_690;
  uint local_684;
  string *local_680;
  string *_result_2;
  FatalMessage local_670;
  FatalMessageVoidify local_4f1;
  FatalMessage local_4f0;
  uint local_374;
  string *local_370;
  string *_result_1;
  uint local_1ec;
  string *local_1e8;
  string *_result;
  FatalMessage local_1d8;
  FatalMessageVoidify local_59;
  RealFourier local_58;
  scoped_ptr<webrtc::RealFourier,_rtc::DefaultDeleter<webrtc::RealFourier>_> local_50 [3];
  size_t local_38;
  size_t block_length_local;
  float *window_local;
  size_t chunk_length_local;
  size_t num_out_channels_local;
  size_t num_in_channels_local;
  LappedTransform *this_local;
  
  local_38 = block_length;
  block_length_local = (size_t)window;
  window_local = (float *)chunk_length;
  chunk_length_local = num_out_channels;
  num_out_channels_local = num_in_channels;
  num_in_channels_local = (size_t)this;
  BlockThunk::BlockThunk(&this->blocker_callback_,this);
  this->num_in_channels_ = num_out_channels_local;
  this->num_out_channels_ = chunk_length_local;
  this->block_length_ = local_38;
  this->chunk_length_ = (size_t)window_local;
  this->block_processor_ = callback;
  Blocker::Blocker(&this->blocker_,this->chunk_length_,this->block_length_,this->num_in_channels_,
                   this->num_out_channels_,(float *)block_length_local,shift_amount,
                   (BlockerCallback *)this);
  iVar1 = RealFourier::FftOrder(this->block_length_);
  RealFourier::Create(&local_58,iVar1);
  rtc::scoped_ptr<webrtc::RealFourier,rtc::DefaultDeleter<webrtc::RealFourier>>::
  scoped_ptr<webrtc::RealFourier,rtc::DefaultDeleter<webrtc::RealFourier>>
            ((scoped_ptr<webrtc::RealFourier,rtc::DefaultDeleter<webrtc::RealFourier>> *)local_50,
             (scoped_ptr<webrtc::RealFourier,_rtc::DefaultDeleter<webrtc::RealFourier>_> *)&local_58
            );
  rtc::ScopedToUnique<webrtc::RealFourier>((rtc *)&this->fft_,local_50);
  rtc::scoped_ptr<webrtc::RealFourier,_rtc::DefaultDeleter<webrtc::RealFourier>_>::~scoped_ptr
            (local_50);
  rtc::scoped_ptr<webrtc::RealFourier,_rtc::DefaultDeleter<webrtc::RealFourier>_>::~scoped_ptr
            ((scoped_ptr<webrtc::RealFourier,_rtc::DefaultDeleter<webrtc::RealFourier>_> *)&local_58
            );
  pRVar2 = std::unique_ptr<webrtc::RealFourier,_std::default_delete<webrtc::RealFourier>_>::
           operator->(&this->fft_);
  iVar1 = (*pRVar2->_vptr_RealFourier[4])();
  sVar3 = RealFourier::ComplexLength(iVar1);
  this->cplx_length_ = sVar3;
  AlignedArray<float>::AlignedArray
            (&this->real_buf_,num_out_channels_local,this->block_length_,0x20);
  AlignedArray<std::complex<float>_>::AlignedArray
            (&this->cplx_pre_,num_out_channels_local,this->cplx_length_,0x20);
  AlignedArray<std::complex<float>_>::AlignedArray
            (&this->cplx_post_,chunk_length_local,this->cplx_length_,0x20);
  _result._7_1_ = 0;
  if ((this->num_in_channels_ == 0) || (this->num_out_channels_ == 0)) {
    rtc::FatalMessageVoidify::FatalMessageVoidify(&local_59);
    rtc::FatalMessage::FatalMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
               ,0x57);
    _result._7_1_ = 1;
    poVar4 = rtc::FatalMessage::stream(&local_1d8);
    poVar4 = std::operator<<(poVar4,"Check failed: num_in_channels_ > 0 && num_out_channels_ > 0");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# ");
    rtc::FatalMessageVoidify::operator&(&local_59,poVar4);
  }
  if ((_result._7_1_ & 1) != 0) {
    rtc::FatalMessage::~FatalMessage(&local_1d8);
  }
  local_1ec = 0;
  local_1e8 = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                        (&this->block_length_,&local_1ec,"block_length_ > 0u");
  if (local_1e8 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
               ,0x58,local_1e8);
    rtc::FatalMessage::stream((FatalMessage *)&_result_1);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_1);
  }
  local_374 = 0;
  local_370 = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                        (&this->chunk_length_,&local_374,"chunk_length_ > 0u");
  if (local_370 == (string *)0x0) {
    _result_2._7_1_ = 0;
    if (this->block_processor_ == (Callback *)0x0) {
      rtc::FatalMessageVoidify::FatalMessageVoidify(&local_4f1);
      rtc::FatalMessage::FatalMessage
                (&local_670,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
                 ,0x5a);
      _result_2._7_1_ = 1;
      poVar4 = rtc::FatalMessage::stream(&local_670);
      poVar4 = std::operator<<(poVar4,"Check failed: block_processor_");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"# ");
      rtc::FatalMessageVoidify::operator&(&local_4f1,poVar4);
    }
    if ((_result_2._7_1_ & 1) != 0) {
      rtc::FatalMessage::~FatalMessage(&local_670);
    }
    local_684 = 0;
    local_690 = this->block_length_ & this->block_length_ - 1;
    local_680 = rtc::CheckEQImpl<unsigned_int,unsigned_long>
                          (&local_684,&local_690,"0u == block_length_ & (block_length_ - 1)");
    if (local_680 == (string *)0x0) {
      return;
    }
    rtc::FatalMessage::FatalMessage
              (&local_808,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
               ,0x5d,local_680);
    rtc::FatalMessage::stream(&local_808);
    rtc::FatalMessage::~FatalMessage(&local_808);
  }
  rtc::FatalMessage::FatalMessage
            (&local_4f0,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
             ,0x59,local_370);
  rtc::FatalMessage::stream(&local_4f0);
  rtc::FatalMessage::~FatalMessage(&local_4f0);
}

Assistant:

LappedTransform::LappedTransform(size_t num_in_channels,
                                 size_t num_out_channels,
                                 size_t chunk_length,
                                 const float* window,
                                 size_t block_length,
                                 size_t shift_amount,
                                 Callback* callback)
    : blocker_callback_(this),
      num_in_channels_(num_in_channels),
      num_out_channels_(num_out_channels),
      block_length_(block_length),
      chunk_length_(chunk_length),
      block_processor_(callback),
      blocker_(chunk_length_,
               block_length_,
               num_in_channels_,
               num_out_channels_,
               window,
               shift_amount,
               &blocker_callback_),
      fft_(rtc::ScopedToUnique(
          RealFourier::Create(RealFourier::FftOrder(block_length_)))),
      cplx_length_(RealFourier::ComplexLength(fft_->order())),
      real_buf_(num_in_channels,
                block_length_,
                RealFourier::kFftBufferAlignment),
      cplx_pre_(num_in_channels,
                cplx_length_,
                RealFourier::kFftBufferAlignment),
      cplx_post_(num_out_channels,
                 cplx_length_,
                 RealFourier::kFftBufferAlignment) {
  RTC_CHECK(num_in_channels_ > 0 && num_out_channels_ > 0);
  RTC_CHECK_GT(block_length_, 0u);
  RTC_CHECK_GT(chunk_length_, 0u);
  RTC_CHECK(block_processor_);

  // block_length_ power of 2?
  RTC_CHECK_EQ(0u, block_length_ & (block_length_ - 1));
}